

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringExplicitLodTests.cpp
# Opt level: O0

FloatFormat *
vkt::texture::anon_unknown_3::getConversionPrecision
          (FloatFormat *__return_storage_ptr__,VkFormat format)

{
  undefined1 local_88 [8];
  FloatFormat fp32;
  FloatFormat fp16;
  FloatFormat reallyLow;
  VkFormat format_local;
  
  tcu::FloatFormat::FloatFormat((FloatFormat *)&fp16.m_maxValue,0,0,8,false,YES,MAYBE,MAYBE);
  tcu::FloatFormat::FloatFormat((FloatFormat *)&fp32.m_maxValue,-0xe,0xf,10,false,MAYBE,MAYBE,MAYBE)
  ;
  tcu::FloatFormat::FloatFormat((FloatFormat *)local_88,-0x7e,0x7f,0x17,true,MAYBE,MAYBE,MAYBE);
  switch(format) {
  case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
  case VK_FORMAT_R5G6B5_UNORM_PACK16:
  case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
    memcpy(__return_storage_ptr__,&fp16.m_maxValue,0x28);
    break;
  default:
    memcpy(__return_storage_ptr__,local_88,0x28);
    break;
  case VK_FORMAT_R8_UNORM:
  case VK_FORMAT_R8_SNORM:
  case VK_FORMAT_R8G8_UNORM:
  case VK_FORMAT_R8G8_SNORM:
  case VK_FORMAT_R8G8B8A8_UNORM:
  case VK_FORMAT_R8G8B8A8_SNORM:
  case VK_FORMAT_B8G8R8A8_UNORM:
  case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
  case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
  case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
    memcpy(__return_storage_ptr__,&fp32.m_maxValue,0x28);
    break;
  case VK_FORMAT_R16_SFLOAT:
  case VK_FORMAT_R16G16_SFLOAT:
  case VK_FORMAT_R16G16B16A16_SFLOAT:
    memcpy(__return_storage_ptr__,&fp32.m_maxValue,0x28);
    break;
  case VK_FORMAT_R32_SFLOAT:
  case VK_FORMAT_R32G32_SFLOAT:
  case VK_FORMAT_R32G32B32A32_SFLOAT:
    memcpy(__return_storage_ptr__,local_88,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::FloatFormat getConversionPrecision (VkFormat format)
{
	const tcu::FloatFormat	reallyLow	(0, 0, 8, false, tcu::YES);
	const tcu::FloatFormat	fp16		(-14, 15, 10, false);
	const tcu::FloatFormat	fp32		(-126, 127, 23, true);

	switch (format)
	{
	    case VK_FORMAT_B4G4R4A4_UNORM_PACK16:
		case VK_FORMAT_R5G6B5_UNORM_PACK16:
		case VK_FORMAT_A1R5G5B5_UNORM_PACK16:
			return reallyLow;

		case VK_FORMAT_R8_UNORM:
		case VK_FORMAT_R8_SNORM:
		case VK_FORMAT_R8G8_UNORM:
		case VK_FORMAT_R8G8_SNORM:
		case VK_FORMAT_R8G8B8A8_UNORM:
		case VK_FORMAT_R8G8B8A8_SNORM:
		case VK_FORMAT_B8G8R8A8_UNORM:
		case VK_FORMAT_A8B8G8R8_UNORM_PACK32:
		case VK_FORMAT_A8B8G8R8_SNORM_PACK32:
		case VK_FORMAT_A2B10G10R10_UNORM_PACK32:
			return fp16;

		case VK_FORMAT_R16_SFLOAT:
		case VK_FORMAT_R16G16_SFLOAT:
		case VK_FORMAT_R16G16B16A16_SFLOAT:
			return fp16;

		case VK_FORMAT_R32_SFLOAT:
		case VK_FORMAT_R32G32_SFLOAT:
		case VK_FORMAT_R32G32B32A32_SFLOAT:
			return fp32;

		default:
			DE_FATAL("Precision not defined for format");
			return fp32;
	}
}